

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV3PosAnimationBlock(Parser *this,Animation *anim)

{
  byte bVar1;
  pointer paVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  uint iIndex;
  aiVectorKey local_48;
  
  pbVar5 = (byte *)this->filePtr;
  iVar6 = 0;
  do {
    if (*pbVar5 == 0x2a) {
      this->filePtr = (char *)(pbVar5 + 1);
      bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_SAMPLE",0x12);
      if (bVar3) {
        anim->mPositionType = TRACK;
      }
      bVar4 = TokenMatch<char_const>(&this->filePtr,"CONTROL_BEZIER_POS_KEY",0x16);
      if (bVar4) {
        anim->mPositionType = BEZIER;
        bVar3 = true;
      }
      bVar4 = TokenMatch<char_const>(&this->filePtr,"CONTROL_TCB_POS_KEY",0x13);
      if (bVar4) {
        anim->mPositionType = TCB;
      }
      else if (bVar3 == false) goto LAB_003d4d00;
      local_48.mTime = 0.0;
      local_48.mValue.x = 0.0;
      local_48.mValue.y = 0.0;
      local_48.mValue.z = 0.0;
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::emplace_back<aiVectorKey>
                (&anim->akeyPositions,&local_48);
      paVar2 = (anim->akeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ParseLV4MeshFloatTriple(this,&paVar2[-1].mValue.x,&iIndex);
      paVar2[-1].mTime = (double)iIndex;
    }
LAB_003d4d00:
    pbVar5 = (byte *)this->filePtr;
    bVar1 = *pbVar5;
    if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003d4d3e;
      this->iLineNumber = this->iLineNumber + 1;
      bVar3 = true;
    }
    else {
      if (bVar1 == 0x7b) {
        iVar6 = iVar6 + 1;
      }
      else if (bVar1 == 0x7d) {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          this->filePtr = (char *)(pbVar5 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar1 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *CONTROL_POS_TRACK chunk (Level 3)");
      }
LAB_003d4d3e:
      bVar3 = false;
    }
    this->bLastWasEndLine = bVar3;
    pbVar5 = pbVar5 + 1;
    this->filePtr = (char *)pbVar5;
  } while( true );
}

Assistant:

void Parser::ParseLV3PosAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the three floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_POS_SAMPLE" ,18))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_POS_KEY" ,22))
            {
                b = true;
                anim.mPositionType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_POS_KEY" ,19))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyPositions.push_back(aiVectorKey());
                aiVectorKey& key = anim.akeyPositions.back();
                ParseLV4MeshFloatTriple(&key.mValue.x,iIndex);
                key.mTime = (double)iIndex;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_POS_TRACK");
    }
}